

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O3

void Diligent::anon_unknown_61::ValidateRayTracingPipelineCreateInfo
               (IRenderDevice *pDevice,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  PIPELINE_TYPE PipelineType;
  PipelineStateDesc *pPVar1;
  RayTracingGeneralShaderGroup *pRVar2;
  RayTracingTriangleHitShaderGroup *pRVar3;
  RayTracingProceduralHitShaderGroup *pRVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  uint uVar7;
  ulong uVar8;
  IShader *pIVar9;
  uint *Args_8;
  bool bVar10;
  char *local_98;
  Char *local_90;
  char *local_88;
  uint local_7c;
  anon_class_16_2_acfc9a23 VerifyShaderGroupName;
  unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
  GroupNames;
  int *piVar6;
  
  iVar5 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
  piVar6 = (int *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(pDevice->super_IObject)._vptr_IObject[0x19])(pDevice);
  PipelineType = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  if (PipelineType != PIPELINE_TYPE_RAY_TRACING) {
    GroupNames._M_h._M_buckets = (__buckets_ptr)GetPipelineTypeString(PipelineType);
    pPVar1 = (PipelineStateDesc *)
             (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    VerifyShaderGroupName.PSODesc = (PipelineStateDesc *)0x6cf608;
    if (pPVar1 != (PipelineStateDesc *)0x0) {
      VerifyShaderGroupName.PSODesc = pPVar1;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[35]>
              (false,"ValidateRayTracingPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,700,(char (*) [16])"Description of ",(char **)&GroupNames,(char (*) [7])0x6a829c,
               (char **)&VerifyShaderGroupName,(char (*) [15])"\' is invalid: ",
               (char (*) [35])"Pipeline type must be RAY_TRACING.");
  }
  if (((char)piVar6[5] == '\0') || ((*(byte *)(CONCAT44(extraout_var_00,iVar5) + 0xf0) & 1) == 0)) {
    GroupNames._M_h._M_buckets =
         (__buckets_ptr)
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    pPVar1 = (PipelineStateDesc *)
             (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    VerifyShaderGroupName.PSODesc = (PipelineStateDesc *)0x6cf608;
    if (pPVar1 != (PipelineStateDesc *)0x0) {
      VerifyShaderGroupName.PSODesc = pPVar1;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[49]>
              (false,"ValidateRayTracingPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2bf,(char (*) [16])"Description of ",(char **)&GroupNames,(char (*) [7])0x6a829c,
               (char **)&VerifyShaderGroupName,(char (*) [15])"\' is invalid: ",
               (char (*) [49])"Standalone ray tracing shaders are not supported");
  }
  Args_8 = (uint *)(CONCAT44(extraout_var_00,iVar5) + 0xb8);
  ValidatePipelineResourceSignatures(&CreateInfo->super_PipelineStateCreateInfo,pDevice);
  ValidatePipelineResourceLayoutDesc((PipelineStateDesc *)CreateInfo,(DeviceFeatures *)(piVar6 + 3))
  ;
  if (*piVar6 == 2) {
    bVar10 = false;
    if (CreateInfo->pShaderRecordName != (char *)0x0) {
      bVar10 = *CreateInfo->pShaderRecordName != '\0';
    }
    if (bVar10 != ((CreateInfo->RayTracingPipeline).ShaderRecordSize != 0)) {
      GroupNames._M_h._M_buckets =
           (__buckets_ptr)
           GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      pPVar1 = (PipelineStateDesc *)
               (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      VerifyShaderGroupName.PSODesc = (PipelineStateDesc *)0x6cf608;
      if (pPVar1 != (PipelineStateDesc *)0x0) {
        VerifyShaderGroupName.PSODesc = pPVar1;
      }
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[87]>
                (false,"ValidateRayTracingPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x2c7,(char (*) [16])"Description of ",(char **)&GroupNames,(char (*) [7])0x6a829c
                 ,(char **)&VerifyShaderGroupName,(char (*) [15])"\' is invalid: ",
                 (char (*) [87])
                 "pShaderRecordName must not be null if RayTracingPipeline.ShaderRecordSize is not zero."
                );
    }
  }
  if (*Args_8 < (uint)(CreateInfo->RayTracingPipeline).MaxRecursionDepth) {
    GroupNames._M_h._M_buckets =
         (__buckets_ptr)
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    pPVar1 = (PipelineStateDesc *)
             (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    VerifyShaderGroupName.PSODesc = (PipelineStateDesc *)0x6cf608;
    if (pPVar1 != (PipelineStateDesc *)0x0) {
      VerifyShaderGroupName.PSODesc = pPVar1;
    }
    local_98 = (char *)CONCAT44(local_98._4_4_,
                                (uint)(CreateInfo->RayTracingPipeline).MaxRecursionDepth);
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],unsigned_int,char[25],unsigned_int,char[3]>
              (false,"ValidateRayTracingPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2cd,(char (*) [16])"Description of ",(char **)&GroupNames,(char (*) [7])0x6a829c,
               (char **)&VerifyShaderGroupName,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"MaxRecursionDepth (",(uint *)&local_98,
               (char (*) [25])") exceeds device limit (",Args_8,(char (*) [3])0x75ce90);
  }
  GroupNames._M_h._M_buckets = &GroupNames._M_h._M_single_bucket;
  GroupNames._M_h._M_bucket_count = 1;
  GroupNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  GroupNames._M_h._M_element_count = 0;
  GroupNames._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  GroupNames._M_h._M_rehash_policy._M_next_resize = 0;
  GroupNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
  VerifyShaderGroupName.GroupNames = &GroupNames;
  local_7c = 0;
  VerifyShaderGroupName.PSODesc = (PipelineStateDesc *)CreateInfo;
  if (CreateInfo->GeneralShaderCount != 0) {
    uVar8 = 0;
    do {
      pRVar2 = CreateInfo->pGeneralShaders;
      ValidateRayTracingPipelineCreateInfo::anon_class_16_2_acfc9a23::operator()
                (&VerifyShaderGroupName,"pGeneralShaders",(Uint32)uVar8,pRVar2[uVar8].Name);
      pIVar9 = pRVar2[uVar8].pShader;
      if (pIVar9 == (IShader *)0x0) {
        local_98 = GetPipelineTypeString
                             ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
        local_88 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_88 == (char *)0x0) {
          local_88 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[17],unsigned_int,char[28]>
                  (false,"ValidateRayTracingPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x2e7,(char (*) [16])"Description of ",&local_98,(char (*) [7])0x6a829c,
                   &local_88,(char (*) [15])"\' is invalid: ",(char (*) [17])"pGeneralShaders[",
                   &local_7c,(char (*) [28])"].pShader must not be null.");
        pIVar9 = pRVar2[uVar8].pShader;
      }
      iVar5 = (*(pIVar9->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      iVar5 = *(int *)(CONCAT44(extraout_var_01,iVar5) + 8);
      if (((iVar5 != 0x100) && (iVar5 != 0x200)) && (iVar5 != 0x2000)) {
        local_98 = GetPipelineTypeString
                             ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
        local_88 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_88 == (char *)0x0) {
          local_88 = "";
        }
        iVar5 = (*((pRVar2[uVar8].pShader)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        local_90 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_02,iVar5) + 8));
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char_const*,char[53]>
                  (false,"ValidateRayTracingPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x2ef,(char (*) [16])"Description of ",&local_98,(char (*) [7])0x6a829c,
                   &local_88,(char (*) [15])"\' is invalid: ",&local_90,
                   (char (*) [53])" is not a valid type for ray tracing general shader.");
      }
      local_7c = local_7c + 1;
      uVar8 = (ulong)local_7c;
    } while (local_7c < CreateInfo->GeneralShaderCount);
  }
  local_90 = (Char *)((ulong)local_90 & 0xffffffff00000000);
  if (CreateInfo->TriangleHitShaderCount != 0) {
    uVar8 = 0;
    do {
      pRVar3 = CreateInfo->pTriangleHitShaders;
      ValidateRayTracingPipelineCreateInfo::anon_class_16_2_acfc9a23::operator()
                (&VerifyShaderGroupName,"pTriangleHitShaders",(Uint32)uVar8,pRVar3[uVar8].Name);
      pIVar9 = pRVar3[uVar8].pClosestHitShader;
      if (pIVar9 == (IShader *)0x0) {
        local_98 = GetPipelineTypeString
                             ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
        local_88 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_88 == (char *)0x0) {
          local_88 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[21],unsigned_int,char[38]>
                  (false,"ValidateRayTracingPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x2fa,(char (*) [16])"Description of ",&local_98,(char (*) [7])0x6a829c,
                   &local_88,(char (*) [15])"\' is invalid: ",(char (*) [21])"pTriangleHitShaders[",
                   (uint *)&local_90,(char (*) [38])"].pClosestHitShader must not be null.");
        pIVar9 = pRVar3[uVar8].pClosestHitShader;
        if (pIVar9 != (IShader *)0x0) goto LAB_004af3f0;
      }
      else {
LAB_004af3f0:
        iVar5 = (*(pIVar9->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (*(int *)(CONCAT44(extraout_var_03,iVar5) + 8) != 0x400) {
          iVar5 = (*((pRVar3[uVar8].pClosestHitShader)->super_IDeviceObject).super_IObject.
                    _vptr_IObject[4])();
          local_98 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_04,iVar5) + 8))
          ;
          LogError<true,char_const*,char[26],char[33],char[8]>
                    (false,"ValidateRayTracingPipelineCreateInfo",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x2fc,&local_98,(char (*) [26])" is not a valid type for ",
                     (char (*) [33])"ray tracing triangle closest hit",(char (*) [8])0x751243);
        }
      }
      if (pRVar3[uVar8].pAnyHitShader != (IShader *)0x0) {
        iVar5 = (*((pRVar3[uVar8].pAnyHitShader)->super_IDeviceObject).super_IObject._vptr_IObject
                  [4])();
        if (*(int *)(CONCAT44(extraout_var_05,iVar5) + 8) != 0x800) {
          iVar5 = (*((pRVar3[uVar8].pAnyHitShader)->super_IDeviceObject).super_IObject._vptr_IObject
                    [4])();
          local_98 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_06,iVar5) + 8))
          ;
          LogError<true,char_const*,char[26],char[29],char[8]>
                    (false,"ValidateRayTracingPipelineCreateInfo",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x2fd,&local_98,(char (*) [26])" is not a valid type for ",
                     (char (*) [29])"ray tracing triangle any hit",(char (*) [8])0x751243);
        }
      }
      uVar7 = (int)local_90 + 1;
      uVar8 = (ulong)uVar7;
      local_90 = (Char *)CONCAT44(local_90._4_4_,uVar7);
    } while (uVar7 < CreateInfo->TriangleHitShaderCount);
  }
  local_90 = (Char *)((ulong)local_90 & 0xffffffff00000000);
  if (CreateInfo->ProceduralHitShaderCount != 0) {
    uVar7 = 0;
    do {
      pRVar4 = CreateInfo->pProceduralHitShaders;
      ValidateRayTracingPipelineCreateInfo::anon_class_16_2_acfc9a23::operator()
                (&VerifyShaderGroupName,"pProceduralHitShaders",uVar7,pRVar4[uVar7].Name);
      pIVar9 = pRVar4[uVar7].pIntersectionShader;
      if (pIVar9 == (IShader *)0x0) {
        local_98 = GetPipelineTypeString
                             ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
        local_88 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_88 == (char *)0x0) {
          local_88 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],unsigned_int,char[40]>
                  (false,"ValidateRayTracingPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x307,(char (*) [16])"Description of ",&local_98,(char (*) [7])0x6a829c,
                   &local_88,(char (*) [15])"\' is invalid: ",
                   (char (*) [23])"pProceduralHitShaders[",(uint *)&local_90,
                   (char (*) [40])"].pIntersectionShader must not be null.");
        pIVar9 = pRVar4[uVar7].pIntersectionShader;
        if (pIVar9 != (IShader *)0x0) goto LAB_004af588;
      }
      else {
LAB_004af588:
        iVar5 = (*(pIVar9->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (*(int *)(CONCAT44(extraout_var_07,iVar5) + 8) != 0x1000) {
          iVar5 = (*((pRVar4[uVar7].pIntersectionShader)->super_IDeviceObject).super_IObject.
                    _vptr_IObject[4])();
          local_98 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_08,iVar5) + 8))
          ;
          LogError<true,char_const*,char[26],char[36],char[8]>
                    (false,"ValidateRayTracingPipelineCreateInfo",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x309,&local_98,(char (*) [26])" is not a valid type for ",
                     (char (*) [36])"ray tracing procedural intersection",(char (*) [8])0x751243);
        }
      }
      if (pRVar4[uVar7].pClosestHitShader != (IShader *)0x0) {
        iVar5 = (*((pRVar4[uVar7].pClosestHitShader)->super_IDeviceObject).super_IObject.
                  _vptr_IObject[4])();
        if (*(int *)(CONCAT44(extraout_var_09,iVar5) + 8) != 0x400) {
          iVar5 = (*((pRVar4[uVar7].pClosestHitShader)->super_IDeviceObject).super_IObject.
                    _vptr_IObject[4])();
          local_98 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_10,iVar5) + 8))
          ;
          LogError<true,char_const*,char[26],char[35],char[8]>
                    (false,"ValidateRayTracingPipelineCreateInfo",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x30a,&local_98,(char (*) [26])" is not a valid type for ",
                     (char (*) [35])"ray tracing procedural closest hit",(char (*) [8])0x751243);
        }
      }
      if (pRVar4[uVar7].pAnyHitShader != (IShader *)0x0) {
        iVar5 = (*((pRVar4[uVar7].pAnyHitShader)->super_IDeviceObject).super_IObject._vptr_IObject
                  [4])();
        if (*(int *)(CONCAT44(extraout_var_11,iVar5) + 8) != 0x800) {
          iVar5 = (*((pRVar4[uVar7].pAnyHitShader)->super_IDeviceObject).super_IObject._vptr_IObject
                    [4])();
          local_98 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_12,iVar5) + 8))
          ;
          LogError<true,char_const*,char[26],char[31],char[8]>
                    (false,"ValidateRayTracingPipelineCreateInfo",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x30b,&local_98,(char (*) [26])" is not a valid type for ",
                     (char (*) [31])"ray tracing procedural any hit",(char (*) [8])0x751243);
        }
      }
      uVar7 = (int)local_90 + 1;
      local_90 = (Char *)CONCAT44(local_90._4_4_,uVar7);
    } while (uVar7 < CreateInfo->ProceduralHitShaderCount);
  }
  std::
  _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&GroupNames._M_h);
  return;
}

Assistant:

void ValidateRayTracingPipelineCreateInfo(const IRenderDevice*                     pDevice,
                                          const RayTracingPipelineStateCreateInfo& CreateInfo) noexcept(false)
{
    const RenderDeviceInfo&     DeviceInfo = pDevice->GetDeviceInfo();
    const RayTracingProperties& RTProps    = pDevice->GetAdapterInfo().RayTracing;
    const PipelineStateDesc&    PSODesc    = CreateInfo.PSODesc;
    if (PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
        LOG_PSO_ERROR_AND_THROW("Pipeline type must be RAY_TRACING.");

    if (!DeviceInfo.Features.RayTracing || (RTProps.CapFlags & RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS) == 0)
        LOG_PSO_ERROR_AND_THROW("Standalone ray tracing shaders are not supported");

    ValidatePipelineResourceSignatures(CreateInfo, pDevice);
    ValidatePipelineResourceLayoutDesc(PSODesc, DeviceInfo.Features);

    if (DeviceInfo.Type == RENDER_DEVICE_TYPE_D3D12)
    {
        if ((CreateInfo.pShaderRecordName != nullptr && *CreateInfo.pShaderRecordName != '\0') != (CreateInfo.RayTracingPipeline.ShaderRecordSize > 0))
            LOG_PSO_ERROR_AND_THROW("pShaderRecordName must not be null if RayTracingPipeline.ShaderRecordSize is not zero.");
    }

    if (CreateInfo.RayTracingPipeline.MaxRecursionDepth > RTProps.MaxRecursionDepth)
    {
        LOG_PSO_ERROR_AND_THROW("MaxRecursionDepth (", Uint32{CreateInfo.RayTracingPipeline.MaxRecursionDepth},
                                ") exceeds device limit (", RTProps.MaxRecursionDepth, ").");
    }

    std::unordered_set<HashMapStringKey> GroupNames;

    auto VerifyShaderGroupName = [&](const char* MemberName, // "pGeneralShaders", "pTriangleHitShaders", or "pProceduralHitShaders"
                                     Uint32      GroupInd,
                                     const char* GroupName) {
        if (GroupName == nullptr)
            LOG_PSO_ERROR_AND_THROW(MemberName, "[", GroupInd, "].Name must not be null.");

        if (GroupName[0] == '\0')
            LOG_PSO_ERROR_AND_THROW(MemberName, "[", GroupInd, "].Name must not be empty.");

        const bool IsNewName = GroupNames.emplace(HashMapStringKey{GroupName}).second;
        if (!IsNewName)
            LOG_PSO_ERROR_AND_THROW(MemberName, "[", GroupInd, "].Name ('", GroupName, "') has already been assigned to another group. All group names must be unique.");
    };

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        const RayTracingGeneralShaderGroup& Group = CreateInfo.pGeneralShaders[i];

        VerifyShaderGroupName("pGeneralShaders", i, Group.Name);

        if (Group.pShader == nullptr)
            LOG_PSO_ERROR_AND_THROW("pGeneralShaders[", i, "].pShader must not be null.");

        switch (Group.pShader->GetDesc().ShaderType)
        {
            case SHADER_TYPE_RAY_GEN:
            case SHADER_TYPE_RAY_MISS:
            case SHADER_TYPE_CALLABLE: break;
            default:
                LOG_PSO_ERROR_AND_THROW(GetShaderTypeLiteralName(Group.pShader->GetDesc().ShaderType), " is not a valid type for ray tracing general shader.");
        }
    }

    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        const RayTracingTriangleHitShaderGroup& Group = CreateInfo.pTriangleHitShaders[i];

        VerifyShaderGroupName("pTriangleHitShaders", i, Group.Name);

        if (Group.pClosestHitShader == nullptr)
            LOG_PSO_ERROR_AND_THROW("pTriangleHitShaders[", i, "].pClosestHitShader must not be null.");

        VALIDATE_SHADER_TYPE(Group.pClosestHitShader, SHADER_TYPE_RAY_CLOSEST_HIT, "ray tracing triangle closest hit")
        VALIDATE_SHADER_TYPE(Group.pAnyHitShader, SHADER_TYPE_RAY_ANY_HIT, "ray tracing triangle any hit")
    }

    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        const RayTracingProceduralHitShaderGroup& Group = CreateInfo.pProceduralHitShaders[i];

        VerifyShaderGroupName("pProceduralHitShaders", i, Group.Name);

        if (Group.pIntersectionShader == nullptr)
            LOG_PSO_ERROR_AND_THROW("pProceduralHitShaders[", i, "].pIntersectionShader must not be null.");

        VALIDATE_SHADER_TYPE(Group.pIntersectionShader, SHADER_TYPE_RAY_INTERSECTION, "ray tracing procedural intersection")
        VALIDATE_SHADER_TYPE(Group.pClosestHitShader, SHADER_TYPE_RAY_CLOSEST_HIT, "ray tracing procedural closest hit")
        VALIDATE_SHADER_TYPE(Group.pAnyHitShader, SHADER_TYPE_RAY_ANY_HIT, "ray tracing procedural any hit")
    }
}